

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O2

int __thiscall
basist::basisu_transcoder::find_slice
          (basisu_transcoder *this,void *pData,uint32_t data_size,uint32_t image_index,
          uint32_t level_index,bool alpha_data)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  byte *pbVar4;
  
  bVar1 = validate_header_quick(this,pData,data_size);
  iVar2 = 0;
  if (bVar1) {
    pbVar4 = (byte *)((long)pData + (ulong)*(uint *)((long)pData + 0x41) + 4);
    iVar2 = -1;
    for (uVar3 = 0; *(uint3 *)((long)pData + 0xe) != uVar3; uVar3 = uVar3 + 1) {
      if (((*(uint3 *)(pbVar4 + -4) == image_index) && (pbVar4[-1] == level_index)) &&
         ((*(char *)((long)pData + 0x14) != '\0' || ((bool)(*pbVar4 & 1) == alpha_data)))) {
        return (int)uVar3;
      }
      pbVar4 = pbVar4 + 0x17;
    }
  }
  return iVar2;
}

Assistant:

int basisu_transcoder::find_slice(const void* pData, uint32_t data_size, uint32_t image_index, uint32_t level_index, bool alpha_data) const
	{
		if (!validate_header_quick(pData, data_size))
		{
			BASISU_DEVEL_ERROR("basisu_transcoder::find_slice: header validation failed\n");
			return false;
		}

		const basis_file_header* pHeader = reinterpret_cast<const basis_file_header*>(pData);
		const uint8_t* pDataU8 = static_cast<const uint8_t*>(pData);
		const basis_slice_desc* pSlice_descs = reinterpret_cast<const basis_slice_desc*>(pDataU8 + pHeader->m_slice_desc_file_ofs);

		// For very large basis files this search could be painful
		// TODO: Binary search this
		for (uint32_t slice_iter = 0; slice_iter < pHeader->m_total_slices; slice_iter++)
		{
			const basis_slice_desc& slice_desc = pSlice_descs[slice_iter];
			if ((slice_desc.m_image_index == image_index) && (slice_desc.m_level_index == level_index))
			{
				if (pHeader->m_tex_format == (int)basis_tex_format::cETC1S)
				{
					const bool slice_alpha = (slice_desc.m_flags & cSliceDescFlagsHasAlpha) != 0;
					if (slice_alpha == alpha_data)
						return slice_iter;
				}
				else
				{
					return slice_iter;
				}
			}
		}

		BASISU_DEVEL_ERROR("basisu_transcoder::find_slice: didn't find slice\n");

		return -1;
	}